

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

int __thiscall CWire::SplitWire(CWire *this,CPoint *pPoint,CWire **ppWireS,CWire **ppWireE)

{
  char cVar1;
  CNet *this_00;
  CPoint *pCVar2;
  int iVar3;
  int iVar4;
  CLayer *this_01;
  CWire *pWire;
  CWire *pWire_00;
  
  if ((this->super_CObject).m_pParent == (CObject *)0x0) {
    __assert_fail("GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                  ,0x4c3,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
  }
  if (((this->super_CObject).m_iState & 4) != 0) {
    cVar1 = pPoint->m_cZ;
    this_01 = GetLayer(this);
    iVar3 = CLayer::Z(this_01);
    if (iVar3 != cVar1) {
      __assert_fail("IsLayerAssigned()? pPoint->Z()==GetLayer()->Z():TRUE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x4c5,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
    }
  }
  iVar4 = IsOn3D(this,pPoint);
  iVar3 = 0;
  if (iVar4 != 0) {
    iVar4 = CPoint::IsSame3D(this->m_pPointS,pPoint);
    if (iVar4 == 0) {
      iVar4 = CPoint::IsSame3D(this->m_pPointE,pPoint);
      iVar3 = 0;
      if (iVar4 == 0) {
        this_00 = (CNet *)(this->super_CObject).m_pParent;
        if (this_00 == (CNet *)0x0) {
          __assert_fail("pNet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                        ,0x4ca,"int CWire::SplitWire(CPoint *, CWire **, CWire **)");
        }
        pWire = New();
        (*(pWire->super_CObject)._vptr_CObject[3])
                  (pWire,(ulong)(uint)(int)this->m_pPointS->m_iX,
                   (ulong)(uint)(int)this->m_pPointS->m_iY,(ulong)(uint)(int)pPoint->m_iX,
                   (ulong)(uint)(int)pPoint->m_iY,(ulong)(uint)(int)pPoint->m_cZ,this);
        (pWire->super_CObject).m_pParent = (CObject *)0x0;
        pWire_00 = New();
        pCVar2 = this->m_pPointE;
        (*(pWire_00->super_CObject)._vptr_CObject[3])
                  (pWire_00,(ulong)(uint)(int)pPoint->m_iX,(ulong)(uint)(int)pPoint->m_iY,
                   (ulong)(uint)(int)pCVar2->m_iX,(ulong)(uint)(int)pCVar2->m_iY,
                   (ulong)(uint)(int)pCVar2->m_cZ,this);
        (pWire_00->super_CObject).m_pParent = (CObject *)0x0;
        CNet::DelWire(this_00,this,0);
        CNet::AddWire(this_00,pWire);
        CNet::AddWire(this_00,pWire_00);
        if (ppWireS != (CWire **)0x0) {
          *ppWireS = pWire;
        }
        iVar3 = 1;
        if (ppWireE != (CWire **)0x0) {
          *ppWireE = pWire_00;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int CWire::SplitWire(CPoint *pPoint, CWire** ppWireS, CWire** ppWireE)
{	
	// make sure it is checked in into the net [6/30/2006 thyeros]
	//assert(IsRouted());

	// replace by parent checking [3/31/2007 thyeros]
	assert(GetParent());

	assert(IsLayerAssigned()? pPoint->Z()==GetLayer()->Z():TRUE);

	if(!IsOn3D(pPoint)||m_pPointS->IsSame3D(pPoint)||m_pPointE->IsSame3D(pPoint))	return	FALSE;

	CNet*	pNet		=	GetParent();
	assert(pNet);

	CWire*	pNewWireS	=	CWire::New();//new	CWire;
	assert(pNewWireS);
	pNewWireS->Initialize(m_pPointS->X(),m_pPointS->Y(),pPoint->X(),pPoint->Y(),pPoint->Z(),this);
	pNewWireS->SetParent(NULL);

	CWire*	pNewWireE	=	CWire::New();//new	CWire;
	assert(pNewWireE);
	pNewWireE->Initialize(pPoint->X(),pPoint->Y(),m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z(),this);
	pNewWireE->SetParent(NULL);

	// check out the current one first [7/6/2006 thyeros]
	// DO NOT delete here [7/8/2006 thyeros]
	pNet->DelWire(this);

	// check in the new two ones [7/6/2006 thyeros]
	pNet->AddWire(pNewWireS);
	pNet->AddWire(pNewWireE);

	if(ppWireS)	*ppWireS	=	pNewWireS;
	if(ppWireE)	*ppWireE	=	pNewWireE;

	return	TRUE;
}